

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::ParenthesisInLayoutQualifierIntegerValuesTest::iterate
          (ParenthesisInLayoutQualifierIntegerValuesTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  qpTestResult qVar8;
  qpTestResult qVar9;
  char *description;
  GLint compile_status;
  GLint link_status;
  char *cs_body_parts [2];
  undefined1 local_1b0 [384];
  long lVar7;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  compile_status = 1;
  link_status = compile_status;
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x144);
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar3) {
    bVar3 = glu::contextSupports(ctxType,(ApiType)0x144);
    cs_body_parts[0] = "#version 430 core\n";
    if (bVar3) {
      cs_body_parts[0] = "#version 440 core\n";
    }
  }
  else {
    cs_body_parts[0] = "#version 420 core\n";
  }
  cs_body_parts[1] = "\nlayout(local_size_x = (4) ) in;\n\nvoid main()\n{\n}\n";
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_compute_shader");
  description = "Pass";
  qVar9 = QP_TEST_RESULT_PASS;
  if (bVar3) {
    GVar5 = (**(code **)(lVar7 + 0x3f0))(0x91b9);
    this->m_cs_id = GVar5;
    GVar5 = (**(code **)(lVar7 + 0x3c8))();
    this->m_po_id = GVar5;
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateShader() and/or glCraeteProgram() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x5fa);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x5fc);
    qVar8 = QP_TEST_RESULT_PASS;
    (**(code **)(lVar7 + 0x12b8))(this->m_cs_id,2,cs_body_parts,0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x5ff);
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_enhanced_layouts");
    (**(code **)(lVar7 + 0x248))(this->m_cs_id);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x611);
    (**(code **)(lVar7 + 0xa70))(this->m_cs_id,0x8b81,&compile_status);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x614);
    qVar9 = QP_TEST_RESULT_PASS;
    if ((bVar2 || bVar3) || (compile_status != 0)) {
      (**(code **)(lVar7 + 0x10))(this->m_po_id,this->m_cs_id);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x61c);
      (**(code **)(lVar7 + 0xce8))(this->m_po_id);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x61f);
      (**(code **)(lVar7 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x622);
      if (link_status != 0 || (bVar2 || bVar3)) {
        if ((compile_status == 0 || link_status == 0) && (bVar2 || bVar3)) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "A compute program was expected to link successfully, but either the compilation and/or linking process has/have failed"
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          description = "Fail";
          qVar9 = QP_TEST_RESULT_FAIL;
        }
        else {
          qVar9 = qVar8;
          if (((link_status == 1) && (!bVar2 && !bVar3)) && (compile_status == 1)) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,
                            "A compute program was expected not to compile and link, but both processes have been executed successfully."
                           );
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            description = "Fail";
            qVar9 = QP_TEST_RESULT_FAIL;
          }
        }
      }
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,qVar9,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ParenthesisInLayoutQualifierIntegerValuesTest::iterate()
{
	/* Only execute the test on implementations supporting GL_ARB_compute_shader */
	const glu::ContextType context_type = m_context.getRenderContext().getType();
	const glw::Functions&  gl			= m_context.getRenderContext().getFunctions();
	bool				   result		= true;

	glw::GLint link_status		= GL_TRUE;
	glw::GLint compile_status   = GL_TRUE;
	bool	   expected_outcome = glu::contextSupports(context_type, glu::ApiType::core(4, 4));

	/* Prepare a compute shader program */
	static const char* cs_body_core = "\n"
									  "layout(local_size_x = (4) ) in;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "}\n";

	const char* cs_body_parts[] = { (!glu::contextSupports(context_type, glu::ApiType::core(4, 3))) ?
										"#version 420 core\n" :
										(!glu::contextSupports(context_type, glu::ApiType::core(4, 4))) ?
										"#version 430 core\n" :
										"#version 440 core\n",
									cs_body_core };
	const unsigned int n_cs_body_parts =
		static_cast<const unsigned int>(sizeof(cs_body_parts) / sizeof(cs_body_parts[0]));

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader"))
	{
		goto end;
	}

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() and/or glCraeteProgram() call(s) failed.");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	gl.shaderSource(m_cs_id, n_cs_body_parts, cs_body_parts, DE_NULL); /* length */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Try to compile the shader object.
	 *
	 * For GL contexts BEFORE 4.40, the test passes if either
	 * the compilation or the linking process fails.
	 *
	 * For GL contexts OF VERSION 4.40 or newer, the test passes
	 * if both the compilation and the linking process succeed.
	 *
	 * If GL_ARB_enhanced_layouts is supported, the latter holds for <= GL4.4 contexts.
	 **/
	if (m_context.getContextInfo().isExtensionSupported("GL_ARB_enhanced_layouts"))
	{
		expected_outcome = true;
	}

	gl.compileShader(m_cs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_cs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_FALSE && !expected_outcome)
	{
		goto end;
	}

	gl.attachShader(m_po_id, m_cs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status == GL_FALSE && !expected_outcome)
	{
		goto end;
	}

	if (expected_outcome && (compile_status == GL_FALSE || link_status == GL_FALSE))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "A compute program was expected to link successfully, but either the "
							  "compilation and/or linking process has/have failed"
						   << tcu::TestLog::EndMessage;

		result = false;
	}
	else if (!expected_outcome && (compile_status == GL_TRUE && link_status == GL_TRUE))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "A compute program was expected not to compile and link, but both processes "
							  "have been executed successfully."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}